

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

int64_t av1_lowbd_pixel_proj_error_c
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      uVar2 = 0;
      uVar5 = (ulong)(uint)width;
      if (width < 1) {
        uVar5 = 0;
      }
      if (height < 1) {
        height = 0;
      }
      for (iVar4 = 0; iVar4 != height; iVar4 = iVar4 + 1) {
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          uVar2 = uVar2 + ((ulong)dat8[uVar6] - (ulong)src8[uVar6]) *
                          ((ulong)dat8[uVar6] - (ulong)src8[uVar6]);
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
      }
    }
    else {
      uVar2 = 0;
      uVar5 = (ulong)(uint)width;
      if (width < 1) {
        uVar5 = 0;
      }
      if (height < 1) {
        height = 0;
      }
      for (iVar4 = 0; iVar4 != height; iVar4 = iVar4 + 1) {
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          lVar3 = (long)((int)((uint)dat8[uVar6] * 0x800 +
                               (flt1[uVar6] + (uint)dat8[uVar6] * -0x10) * xq[1] + 0x400) >> 0xb) -
                  (ulong)src8[uVar6];
          uVar2 = uVar2 + lVar3 * lVar3;
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        flt1 = flt1 + flt1_stride;
      }
    }
  }
  else if (params->r[1] < 1) {
    uVar2 = 0;
    uVar5 = (ulong)(uint)width;
    if (width < 1) {
      uVar5 = 0;
    }
    if (height < 1) {
      height = 0;
    }
    for (iVar4 = 0; iVar4 != height; iVar4 = iVar4 + 1) {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        lVar3 = (long)((int)((uint)dat8[uVar6] * 0x800 +
                             (flt0[uVar6] + (uint)dat8[uVar6] * -0x10) * *xq + 0x400) >> 0xb) -
                (ulong)src8[uVar6];
        uVar2 = uVar2 + lVar3 * lVar3;
      }
      dat8 = dat8 + dat_stride;
      src8 = src8 + src_stride;
      flt0 = flt0 + flt0_stride;
    }
  }
  else {
    uVar2 = 0;
    uVar5 = (ulong)(uint)width;
    if (width < 1) {
      uVar5 = uVar2;
    }
    if (height < 1) {
      height = 0;
    }
    for (iVar4 = 0; iVar4 != height; iVar4 = iVar4 + 1) {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        bVar1 = dat8[uVar6];
        lVar3 = (long)((int)((flt0[uVar6] + (uint)bVar1 * -0x10) * *xq + (uint)bVar1 * 0x800 +
                             (flt1[uVar6] + (uint)bVar1 * -0x10) * xq[1] + 0x400) >> 0xb) -
                (ulong)src8[uVar6];
        uVar2 = uVar2 + lVar3 * lVar3;
      }
      dat8 = dat8 + dat_stride;
      src8 = src8 + src_stride;
      flt1 = flt1 + flt1_stride;
      flt0 = flt0 + flt0_stride;
    }
  }
  return uVar2;
}

Assistant:

int64_t av1_lowbd_pixel_proj_error_c(const uint8_t *src8, int width, int height,
                                     int src_stride, const uint8_t *dat8,
                                     int dat_stride, int32_t *flt0,
                                     int flt0_stride, int32_t *flt1,
                                     int flt1_stride, int xq[2],
                                     const sgr_params_type *params) {
  int i, j;
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        assert(flt1[j] < (1 << 15) && flt1[j] > -(1 << 15));
        assert(flt0[j] < (1 << 15) && flt0[j] > -(1 << 15));
        const int32_t u = (int32_t)(dat[j] << SGRPROJ_RST_BITS);
        int32_t v = u << SGRPROJ_PRJ_BITS;
        v += xq[0] * (flt0[j] - u) + xq[1] * (flt1[j] - u);
        const int32_t e =
            ROUND_POWER_OF_TWO(v, SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
    }
  } else if (params->r[0] > 0) {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        assert(flt0[j] < (1 << 15) && flt0[j] > -(1 << 15));
        const int32_t u = (int32_t)(dat[j] << SGRPROJ_RST_BITS);
        int32_t v = u << SGRPROJ_PRJ_BITS;
        v += xq[0] * (flt0[j] - u);
        const int32_t e =
            ROUND_POWER_OF_TWO(v, SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
    }
  } else if (params->r[1] > 0) {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        assert(flt1[j] < (1 << 15) && flt1[j] > -(1 << 15));
        const int32_t u = (int32_t)(dat[j] << SGRPROJ_RST_BITS);
        int32_t v = u << SGRPROJ_PRJ_BITS;
        v += xq[1] * (flt1[j] - u);
        const int32_t e =
            ROUND_POWER_OF_TWO(v, SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt1 += flt1_stride;
    }
  } else {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t e = (int32_t)(dat[j]) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }

  return err;
}